

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cba.h
# Opt level: O0

int Cba_NtkIsSeq(Cba_Ntk_t *p)

{
  int iVar1;
  Cba_Ntk_t *p_00;
  int local_1c;
  int iObj;
  Cba_Ntk_t *p_local;
  
  if (((byte)p->field_0x14 >> 2 & 1) == 0) {
    if (((byte)p->field_0x14 >> 1 & 1) == 0) {
      if ((((byte)p->field_0x14 >> 2 & 1) != 0) || (((byte)p->field_0x14 >> 1 & 1) != 0)) {
        __assert_fail("!p->fSeq && !p->fComb",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/cba/cba.h"
                      ,0x213,"int Cba_NtkIsSeq(Cba_Ntk_t *)");
      }
      for (local_1c = 1; iVar1 = Vec_StrSize(&p->vObjType), local_1c < iVar1;
          local_1c = local_1c + 1) {
        iVar1 = Cba_ObjIsBox(p,local_1c);
        if (iVar1 != 0) {
          iVar1 = Cba_ObjIsBoxUser(p,local_1c);
          if (iVar1 == 0) {
            iVar1 = Cba_ObjIsSeq(p,local_1c);
            if (iVar1 != 0) {
              p->field_0x14 = p->field_0x14 & 0xfb | 4;
              return 1;
            }
          }
          else {
            p_00 = Cba_ObjNtk(p,local_1c);
            iVar1 = Cba_NtkIsSeq(p_00);
            if (iVar1 != 0) {
              p->field_0x14 = p->field_0x14 & 0xfb | 4;
              return 1;
            }
          }
        }
      }
      p->field_0x14 = p->field_0x14 & 0xfd | 2;
      p_local._4_4_ = 0;
    }
    else {
      p_local._4_4_ = 0;
    }
  }
  else {
    p_local._4_4_ = 1;
  }
  return p_local._4_4_;
}

Assistant:

static inline int Cba_NtkIsSeq( Cba_Ntk_t * p )
{
    int iObj;
    if ( p->fSeq )
        return 1;
    if ( p->fComb )
        return 0;
    assert( !p->fSeq && !p->fComb );
    Cba_NtkForEachBox( p, iObj )
        if ( Cba_ObjIsBoxUser(p, iObj) )
        {
            if ( Cba_NtkIsSeq( Cba_ObjNtk(p, iObj) ) )
            {
                p->fSeq = 1;
                return 1;
            }
        }
        else if ( Cba_ObjIsSeq(p, iObj) )
        {
            p->fSeq = 1;
            return 1;
        }
    p->fComb = 1;
    return 0;
}